

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3ColumnsFromExprList(Parse *pParse,ExprList *pEList,i16 *pnCol,Column **paCol)

{
  u8 uVar1;
  sqlite3 *db;
  Table *pTVar2;
  i16 *piVar3;
  ushort uVar4;
  uint uVar5;
  Column *pCVar6;
  Expr *pEVar7;
  byte *pKey;
  void *pvVar8;
  Column *pCVar9;
  Column **extraout_RAX;
  Column **ppCVar10;
  ulong uVar11;
  byte bVar12;
  char *z;
  ulong uVar13;
  ExprList_item *pEVar14;
  long lVar15;
  u32 cnt;
  ExprList_item *local_70;
  Column **local_68;
  Column *local_60;
  i16 *local_58;
  ulong local_50;
  Hash ht;
  
  db = pParse->db;
  ht.ht = (_ht *)0x0;
  ht.htsize = 0;
  ht.count = 0;
  ht.first = (HashElem *)0x0;
  if (pEList == (ExprList *)0x0) {
    pCVar6 = (Column *)0x0;
    uVar5 = 0;
  }
  else {
    uVar5 = pEList->nExpr;
    pCVar6 = (Column *)sqlite3DbMallocZero(db,(long)(int)uVar5 << 5);
  }
  *pnCol = (i16)uVar5;
  *paCol = pCVar6;
  local_70 = pEList->a;
  if ((int)uVar5 < 1) {
    uVar5 = 0;
  }
  local_50 = (ulong)uVar5;
  uVar13 = 0;
  local_68 = paCol;
  local_60 = pCVar6;
  local_58 = pnCol;
  do {
    uVar11 = local_50;
    if (uVar13 == local_50) {
LAB_0015c46a:
      sqlite3HashClear(&ht);
      piVar3 = local_58;
      pCVar6 = local_60;
      ppCVar10 = extraout_RAX;
      if (db->mallocFailed != '\0') {
        for (lVar15 = 0; (uVar11 & 0xffffffff) << 5 != lVar15; lVar15 = lVar15 + 0x20) {
          sqlite3DbFree(db,*(void **)((long)&pCVar6->zName + lVar15));
        }
        sqlite3DbFree(db,pCVar6);
        *local_68 = (Column *)0x0;
        *piVar3 = 0;
        ppCVar10 = local_68;
      }
      return (int)ppCVar10;
    }
    if (db->mallocFailed != '\0') {
      uVar11 = uVar13 & 0xffffffff;
      goto LAB_0015c46a;
    }
    z = local_70[uVar13].zName;
    if (z == (char *)0x0) {
      pEVar14 = local_70 + uVar13;
      for (pEVar7 = sqlite3ExprSkipCollate(pEVar14->pExpr); uVar1 = pEVar7->op, uVar1 == 'z';
          pEVar7 = pEVar7->pRight) {
      }
      if (uVar1 == '\x1b') {
        pCVar9 = (Column *)&pEVar7->u;
      }
      else if ((uVar1 == 0x98) && (pTVar2 = pEVar7->pTab, pTVar2 != (Table *)0x0)) {
        uVar4 = pEVar7->iColumn;
        if ((short)uVar4 < 0) {
          uVar4 = pTVar2->iPKey;
          z = "rowid";
          if ((short)uVar4 < 0) goto LAB_0015c378;
        }
        pCVar9 = pTVar2->aCol + uVar4;
      }
      else {
        pCVar9 = (Column *)&pEVar14->zSpan;
      }
      z = pCVar9->zName;
      if (z != (char *)0x0) goto LAB_0015c378;
      pKey = (byte *)sqlite3MPrintf(db,"column%d",(ulong)((int)uVar13 + 1));
    }
    else {
LAB_0015c378:
      pKey = (byte *)sqlite3DbStrDup(db,z);
    }
    cnt = 0;
    while (pKey != (byte *)0x0) {
      pvVar8 = sqlite3HashFind(&ht,(char *)pKey);
      if (pvVar8 == (void *)0x0) {
        pCVar6->zName = (char *)pKey;
        pCVar9 = (Column *)sqlite3HashInsert(&ht,(char *)pKey,pCVar6);
        if (pCVar9 == pCVar6) {
          sqlite3OomFault(db);
        }
        goto LAB_0015c43b;
      }
      uVar5 = sqlite3Strlen30((char *)pKey);
      if (uVar5 == 0) {
        uVar5 = 0;
      }
      else {
        uVar11 = (ulong)uVar5;
        do {
          if (uVar11 < 2) {
            bVar12 = *pKey;
            uVar11 = 0;
            break;
          }
          uVar11 = uVar11 - 1;
          bVar12 = pKey[uVar11 & 0xffffffff];
        } while (0xfffffffffffffff5 < (ulong)bVar12 - 0x3a);
        if (bVar12 == 0x3a) {
          uVar5 = (uint)uVar11;
        }
      }
      cnt = cnt + 1;
      pKey = (byte *)sqlite3MPrintf(db,"%.*z:%u",(ulong)uVar5,pKey);
      if (3 < cnt) {
        sqlite3_randomness(4,&cnt);
      }
    }
    pCVar6->zName = (char *)0x0;
LAB_0015c43b:
    uVar13 = uVar13 + 1;
    pCVar6 = pCVar6 + 1;
  } while( true );
}

Assistant:

SQLITE_PRIVATE int sqlite3ColumnsFromExprList(
  Parse *pParse,          /* Parsing context */
  ExprList *pEList,       /* Expr list from which to derive column names */
  i16 *pnCol,             /* Write the number of columns here */
  Column **paCol          /* Write the new column list here */
){
  sqlite3 *db = pParse->db;   /* Database connection */
  int i, j;                   /* Loop counters */
  u32 cnt;                    /* Index added to make the name unique */
  Column *aCol, *pCol;        /* For looping over result columns */
  int nCol;                   /* Number of columns in the result set */
  char *zName;                /* Column name */
  int nName;                  /* Size of name in zName[] */
  Hash ht;                    /* Hash table of column names */

  sqlite3HashInit(&ht);
  if( pEList ){
    nCol = pEList->nExpr;
    aCol = sqlite3DbMallocZero(db, sizeof(aCol[0])*nCol);
    testcase( aCol==0 );
  }else{
    nCol = 0;
    aCol = 0;
  }
  assert( nCol==(i16)nCol );
  *pnCol = nCol;
  *paCol = aCol;

  for(i=0, pCol=aCol; i<nCol && !db->mallocFailed; i++, pCol++){
    /* Get an appropriate name for the column
    */
    if( (zName = pEList->a[i].zName)!=0 ){
      /* If the column contains an "AS <name>" phrase, use <name> as the name */
    }else{
      Expr *pColExpr = sqlite3ExprSkipCollate(pEList->a[i].pExpr);
      while( pColExpr->op==TK_DOT ){
        pColExpr = pColExpr->pRight;
        assert( pColExpr!=0 );
      }
      if( pColExpr->op==TK_COLUMN && pColExpr->pTab!=0 ){
        /* For columns use the column name name */
        int iCol = pColExpr->iColumn;
        Table *pTab = pColExpr->pTab;
        if( iCol<0 ) iCol = pTab->iPKey;
        zName = iCol>=0 ? pTab->aCol[iCol].zName : "rowid";
      }else if( pColExpr->op==TK_ID ){
        assert( !ExprHasProperty(pColExpr, EP_IntValue) );
        zName = pColExpr->u.zToken;
      }else{
        /* Use the original text of the column expression as its name */
        zName = pEList->a[i].zSpan;
      }
    }
    if( zName ){
      zName = sqlite3DbStrDup(db, zName);
    }else{
      zName = sqlite3MPrintf(db,"column%d",i+1);
    }

    /* Make sure the column name is unique.  If the name is not unique,
    ** append an integer to the name so that it becomes unique.
    */
    cnt = 0;
    while( zName && sqlite3HashFind(&ht, zName)!=0 ){
      nName = sqlite3Strlen30(zName);
      if( nName>0 ){
        for(j=nName-1; j>0 && sqlite3Isdigit(zName[j]); j--){}
        if( zName[j]==':' ) nName = j;
      }
      zName = sqlite3MPrintf(db, "%.*z:%u", nName, zName, ++cnt);
      if( cnt>3 ) sqlite3_randomness(sizeof(cnt), &cnt);
    }
    pCol->zName = zName;
    sqlite3ColumnPropertiesFromName(0, pCol);
    if( zName && sqlite3HashInsert(&ht, zName, pCol)==pCol ){
      sqlite3OomFault(db);
    }
  }
  sqlite3HashClear(&ht);
  if( db->mallocFailed ){
    for(j=0; j<i; j++){
      sqlite3DbFree(db, aCol[j].zName);
    }
    sqlite3DbFree(db, aCol);
    *paCol = 0;
    *pnCol = 0;
    return SQLITE_NOMEM_BKPT;
  }
  return SQLITE_OK;
}